

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zmqBrokerServer.cpp
# Opt level: O0

void __thiscall
helics::apps::zmqBrokerServer::startServer
          (zmqBrokerServer *this,json *val,shared_ptr<helics::apps::TypedBrokerServer> *param_3)

{
  string_view message;
  string_view message_00;
  json *in_RSI;
  char *in_RDI;
  lock_guard<std::mutex> tlock;
  mutex_type *in_stack_ffffffffffffff88;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_ffffffffffffffa0;
  type *in_stack_ffffffffffffffb8;
  thread *in_stack_ffffffffffffffc0;
  
  if (in_RSI == (json *)0x0) {
    in_RSI = &::null_abi_cxx11_;
  }
  *(json **)(in_RDI + 0x38) = in_RSI;
  if ((in_RDI[0x60] & 1U) != 0) {
    CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_ffffffffffffffa0,in_RDI);
    message._M_str = (char *)in_RSI;
    message._M_len = (size_t)in_stack_ffffffffffffff88;
    TypedBrokerServer::logMessage(message);
  }
  if ((in_RDI[0x61] & 1U) != 0) {
    CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (in_stack_ffffffffffffffa0,in_RDI);
    message_00._M_str = (char *)in_RSI;
    message_00._M_len = (size_t)in_stack_ffffffffffffff88;
    TypedBrokerServer::logMessage(message_00);
  }
  CLI::std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)in_RSI,in_stack_ffffffffffffff88);
  std::thread::
  thread<helics::apps::zmqBrokerServer::startServer(nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>const*,std::shared_ptr<helics::apps::TypedBrokerServer>const&)::__0,,void>
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  CLI::std::thread::operator=((thread *)in_RSI,(thread *)in_stack_ffffffffffffff88);
  CLI::std::thread::~thread((thread *)0x1f5eb9);
  CLI::std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x1f5ec3);
  return;
}

Assistant:

void zmqBrokerServer::startServer(const nlohmann::json* val,
                                  const std::shared_ptr<TypedBrokerServer>& /*ptr*/)
{
    config_ = (val != nullptr) ? val : &null;
#ifdef HELICS_ENABLE_ZMQ_CORE
    if (zmq_enabled_) {
        logMessage("starting zmq broker server");
    }
    if (zmqss_enabled_) {
        logMessage("starting zmq ss broker server");
    }
    std::lock_guard<std::mutex> tlock(threadGuard);
    mainLoopThread = std::thread([this]() { mainLoop(); });
#endif
}